

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O2

void objrevert(void *ctx0,mcmon objn)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uchar *puVar5;
  uchar *puVar6;
  bool bVar7;
  
  puVar5 = mcmlck((mcmcxdef *)ctx0,objn);
  puVar6 = puVar5 + (ulong)*(ushort *)(puVar5 + 4) * 2 + 0xe;
  uVar2 = *(ushort *)(puVar5 + 2);
  *(uint *)(puVar5 + 6) = *(uint *)(puVar5 + 10);
  uVar4 = *(uint *)(puVar5 + 10) & 0xffff;
  while (bVar7 = uVar4 != 0, uVar4 = uVar4 - 1, bVar7) {
    puVar6[5] = puVar6[5] & 0xfd;
    puVar6 = puVar6 + (ulong)*(ushort *)(puVar6 + 3) + 6;
  }
  uVar3 = *(ushort *)
           (*(long *)((long)ctx0 + (ulong)(objn >> 8) * 8 + 0x30) + (ulong)(objn & 0xff) * 2);
  puVar1 = (ushort *)
           (*(long *)(**ctx0 + (ulong)(uVar3 >> 8) * 8) + 0x14 + (ulong)((uVar3 & 0xff) << 5));
  *puVar1 = *puVar1 | 1;
  mcmunlck((mcmcxdef *)ctx0,objn);
  if ((uVar2 & 2) == 0) {
    return;
  }
  objindx((mcmcxdef *)ctx0,objn);
  return;
}

Assistant:

void objrevert(void *ctx0, mcmon objn)
{
    mcmcxdef *mctx = (mcmcxdef *)ctx0;
    uchar    *p;
    prpdef   *pr;
    int       cnt;
    int       indexed;
    
    p = mcmlck(mctx, objn);
    pr = objprp(p);
    indexed = objflg(p) & OBJFINDEX;
    
    /* restore original settings */
    objsfree(p, objrst(p));
    objsnp(p, objstat(p));

    /* go through original properties and remove 'ignore' flag if set */
    for (cnt = objnprop(p) ; cnt ; pr = objpnxt(pr), --cnt)
        prpflg(pr) &= ~PRPFIGN;
    
    /* touch object and unlock it */
    mcmtch(mctx, objn);
    mcmunlck(mctx, objn);
    
    /* if it's indexed, rebuild the index */
    if (indexed) objindx(mctx, objn);
}